

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hxx
# Opt level: O0

void __thiscall
FileParse::Child<std::optional<BSDFData::LengthWithCavity>_>::Child
          (Child<std::optional<BSDFData::LengthWithCavity>_> *this,string *nodeName,
          optional<BSDFData::LengthWithCavity> *data,size_t index)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [24];
  size_t index_local;
  optional<BSDFData::LengthWithCavity> *data_local;
  string *nodeName_local;
  Child<std::optional<BSDFData::LengthWithCavity>_> *this_local;
  
  local_60 = &local_58;
  local_38._16_8_ = index;
  index_local = (size_t)data;
  data_local = (optional<BSDFData::LengthWithCavity> *)nodeName;
  nodeName_local = (string *)this;
  std::__cxx11::string::string((string *)local_60,nodeName);
  local_38._0_8_ = &local_58;
  local_38._8_8_ = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_6d);
  __l._M_len = local_38._8_8_;
  __l._M_array = (iterator)local_38._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->nodeNames,__l,local_6d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_6d);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38;
  do {
    local_90 = local_90 + -1;
    std::__cxx11::string::~string((string *)local_90);
  } while (local_90 != &local_58);
  this->data = (optional<BSDFData::LengthWithCavity> *)index_local;
  this->index = local_38._16_8_;
  return;
}

Assistant:

Child(const std::string & nodeName, T & data, size_t index = 0u) :
            nodeNames({nodeName}), data(data), index(index)
        {}